

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions2.cpp
# Opt level: O2

void __thiscall converterApp::loadFile(converterApp *this,string *file)

{
  istream *piVar1;
  long lVar2;
  pointer *__ptr;
  char cVar3;
  char *in_R9;
  string shortname;
  string line;
  double value;
  AssertionResult gtest_ar_;
  ifstream input;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&input,(string *)file,_S_in);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = (abStack_218[*(long *)(_input + -0x18)] & 5) == 0;
  if (gtest_ar_.success_) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&input,(string *)&line);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      if (line._M_string_length != 0) {
        cVar3 = (char)&line;
        std::__cxx11::string::find(cVar3,0x2e);
        std::__cxx11::string::find_first_not_of(cVar3,0x20);
        lVar2 = std::__cxx11::string::find_first_of((char *)&line,0x163825);
        std::__cxx11::string::substr((ulong)&gtest_ar_,(ulong)&line);
        while (*(char *)(CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + -1 +
                        (long)gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) == ' ') {
          std::__cxx11::string::pop_back();
        }
        shortname._M_dataplus._M_p = (pointer)&shortname.field_2;
        shortname._M_string_length = 0;
        shortname.field_2._M_local_buf[0] = '\0';
        if (line._M_dataplus._M_p[lVar2] == '[') {
          std::__cxx11::string::find(cVar3,0x5d);
          std::__cxx11::string::substr((ulong)&value,(ulong)&line);
          std::__cxx11::string::operator=((string *)&shortname,(string *)&value);
          std::__cxx11::string::~string((string *)&value);
        }
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&input,(string *)&line);
        value = std::__cxx11::stod(&line,(size_t *)0x0);
        std::vector<convValue,std::allocator<convValue>>::
        emplace_back<std::__cxx11::string&,std::__cxx11::string&,double&>
                  ((vector<convValue,std::allocator<convValue>> *)&this->unit_conv,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_,
                   &shortname,&value);
        std::__cxx11::string::~string((string *)&shortname);
        std::__cxx11::string::~string((string *)&gtest_ar_);
      }
    }
    std::__cxx11::string::~string((string *)&line);
  }
  else {
    testing::Message::Message((Message *)&shortname);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&line,(internal *)&gtest_ar_,(AssertionResult *)"input","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions2.cpp"
               ,0x1f,line._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&shortname);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    std::__cxx11::string::~string((string *)&line);
    if (shortname._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)shortname._M_dataplus._M_p + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  std::ifstream::~ifstream(&input);
  return;
}

Assistant:

void loadFile(const std::string& file)
    {
        std::ifstream input(file);
        ASSERT_TRUE(input);
        std::string line;
        while (std::getline(input, line)) {
            if (line.empty()) {
                continue;
            }
            auto ploc = line.find_first_of('.');
            auto namestartloc = line.find_first_not_of(' ', ploc + 1);
            auto nameend = line.find_first_of("[:", namestartloc + 1);
            std::string name =
                line.substr(namestartloc, nameend - namestartloc);
            while (name.back() == ' ') {
                name.pop_back();
            }
            std::string shortname;
            if (line[nameend] == '[') {
                auto snameend = line.find_first_of(']', nameend + 1);
                shortname = line.substr(nameend + 1, snameend - nameend - 1);
            }
            std::getline(input, line);
            double value = stod(line);
            unit_conv.emplace_back(name, shortname, value);
        }
    }